

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::MaskProportionalityCase::init
          (MaskProportionalityCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  GLenum GVar2;
  int iVar3;
  int extraout_EAX;
  int iVar4;
  undefined1 local_1a0 [384];
  
  pTVar1 = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  MultisampleCase::init(&this->super_MultisampleCase,ctx);
  local_1a0._0_8_ = pTVar1;
  if (this->m_type == CASETYPE_ALPHA_TO_COVERAGE) {
    glwEnable(0x809e);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x4f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"GL_SAMPLE_ALPHA_TO_COVERAGE is enabled",0x26);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    glwEnable(0x80a0);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glEnable(GL_SAMPLE_COVERAGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x4ff);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"GL_SAMPLE_COVERAGE is enabled",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  iVar4 = (this->super_MultisampleCase).m_numSamples;
  iVar3 = tcu::CommandLine::getTestIterationCount
                    (((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_cmdLine);
  iVar4 = iVar4 * 5;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = 2;
  if (2 < iVar4) {
    iVar3 = iVar4;
  }
  this->m_numIterations = iVar3;
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  return extraout_EAX;
}

Assistant:

void MaskProportionalityCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	MultisampleCase::init();

	if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
	{
		GLU_CHECK_CALL(glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE));
		log << TestLog::Message << "GL_SAMPLE_ALPHA_TO_COVERAGE is enabled" << TestLog::EndMessage;
	}
	else
	{
		DE_ASSERT(m_type == CASETYPE_SAMPLE_COVERAGE || m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED);

		GLU_CHECK_CALL(glEnable(GL_SAMPLE_COVERAGE));
		log << TestLog::Message << "GL_SAMPLE_COVERAGE is enabled" << TestLog::EndMessage;
	}

	m_numIterations = de::max(2, getIterationCount(m_testCtx, m_numSamples * 5));

	randomizeViewport(); // \note Using the same viewport for every iteration since coverage mask may depend on window-relative pixel coordinate.
}